

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

ON_RenderMeshInfo * __thiscall ON_Mesh::GetRenderMeshInfo(ON_Mesh *this)

{
  ON_UserData *p;
  CTtRenderMeshInfoUserData *pCVar1;
  ON_UUID local_18;
  
  local_18 = ON_ClassId::Uuid(&CTtRenderMeshInfoUserData::m_CTtRenderMeshInfoUserData_class_rtti);
  p = ON_Object::GetUserData((ON_Object *)this,&local_18);
  pCVar1 = CTtRenderMeshInfoUserData::Cast(&p->super_ON_Object);
  if (pCVar1 != (CTtRenderMeshInfoUserData *)0x0) {
    pCVar1 = (CTtRenderMeshInfoUserData *)&pCVar1->m_info;
  }
  return (ON_RenderMeshInfo *)pCVar1;
}

Assistant:

const ON_RenderMeshInfo* ON_Mesh::GetRenderMeshInfo() const
{
  CTtRenderMeshInfoUserData* pUD = CTtRenderMeshInfoUserData::Cast(GetUserData(ON_CLASS_ID(CTtRenderMeshInfoUserData)));
  if (nullptr == pUD)
    return nullptr;
  return &pUD->Info();
}